

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QString * Mustache::Renderer::readTagName
                    (QString *__return_storage_ptr__,QString *content,int pos,int endPos)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  AllocationOption AVar5;
  long lVar6;
  char16_t cVar7;
  wchar32 wVar8;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  AVar5 = Grow;
  if (0 < endPos - pos) {
    AVar5 = endPos - pos;
  }
  QString::reallocData((longlong)__return_storage_ptr__,AVar5);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&pAVar1->i = (byte)pAVar1->i | 1;
  }
  pcVar3 = (content->d).ptr;
  lVar6 = (long)pos;
  while (((cVar7 = pcVar3[lVar6], (ushort)cVar7 - 9 < 5 || (cVar7 == L' ')) ||
         ((0x7f < (ushort)cVar7 &&
          (((cVar7 == L'\x85' || ((uint)(ushort)cVar7 == L'\xa0')) ||
           (cVar4 = QChar::isSpace_helper((uint)(ushort)cVar7), cVar4 != '\0'))))))) {
    lVar6 = lVar6 + 1;
  }
  while( true ) {
    if (((ushort)cVar7 < 0x21) && ((0x100003e00U >> ((ulong)(ushort)cVar7 & 0x3f) & 1) != 0)) {
      return __return_storage_ptr__;
    }
    wVar8 = (wchar32)(ushort)cVar7;
    if ((uint)wVar8 < 0x80) {
      cVar4 = '\0';
    }
    else {
      if (wVar8 == L'\x85') {
        return __return_storage_ptr__;
      }
      if (wVar8 == L'\xa0') {
        return __return_storage_ptr__;
      }
      cVar4 = QChar::isSpace_helper(wVar8);
    }
    if (endPos <= lVar6) {
      return __return_storage_ptr__;
    }
    if (cVar4 != '\0') break;
    QString::append((QChar)(char16_t)__return_storage_ptr__);
    cVar7 = (content->d).ptr[lVar6 + 1];
    lVar6 = lVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QString Renderer::readTagName(const QString& content, int pos, int endPos)
{
	QString name;
	name.reserve(endPos - pos);
	while (content.at(pos).isSpace()) {
		++pos;
	}
	while (!content.at(pos).isSpace() && pos < endPos) {
		name += content.at(pos);
		++pos;
	}
	return name;
}